

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int lh_record_insert(unqlite_kv_engine *pKv,void *pKey,sxu32 nKeyLen,void *pData,
                    unqlite_int64 nDataLen,int is_append)

{
  ushort uVar1;
  sxu32 nSize;
  lhash_kv_engine *plVar2;
  lhpage *plVar3;
  SyMutexMethods *pSVar4;
  _func_int *p_Var5;
  SyMemBlock *pSVar6;
  void *pChunk;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  pgno *ppVar12;
  lhcell *pCell;
  lhash_bmap_rec *plVar13;
  SyMemBackend *pPage_00;
  unqlite_kv_io *puVar14;
  _func_void **pp_Var15;
  ulong uVar16;
  lhash_kv_engine *plVar17;
  uchar *puVar18;
  SyMemBackend *pSVar19;
  ulong uVar20;
  undefined1 *puVar21;
  sxu64 sVar22;
  _func_void **pp_Var23;
  pgno pVar24;
  bool bVar25;
  unqlite_page *pNew;
  unqlite_page *pRaw;
  lhpage *pPage;
  unqlite_page *pNew_1;
  undefined1 *local_a8;
  SyMemBackend *local_90;
  _func_void **local_88;
  SyBlob local_80;
  lhpage *local_60;
  ulong local_58;
  lhpage *local_50;
  SyMemBackend *local_48;
  SyMemBackend *local_40;
  SyMemBackend *local_38;
  
  local_60 = (lhpage *)CONCAT44(local_60._4_4_,is_append);
  uVar16 = nDataLen;
  iVar7 = (*pKv->pIo->xGet)(pKv->pIo->pHandle,1,(unqlite_page **)(pKv + 0x1a));
  if (iVar7 != 0) {
    return iVar7;
  }
  local_88 = (_func_void **)pKey;
  uVar8 = (*(code *)pKv[0x18].pIo)(pKey,nKeyLen);
  iVar7 = 0;
  local_58 = nDataLen;
  do {
    uVar11 = (ulong)(*(int *)&pKv[0x26].pIo - 1U & uVar8);
    uVar20 = (ulong)((int)pKv[0x25].pIo - 1U & uVar8);
    if (uVar11 < (ulong)((long)&(pKv[0x25].pIo)->pHandle + (long)&(pKv[0x24].pIo)->pHandle)) {
      uVar20 = uVar11;
    }
    if (*(int *)&pKv[0x1c].pIo != 0) {
      for (ppVar12 = (pgno *)(&(pKv[0x1b].pIo)->pHandle)
                             [*(int *)((long)&pKv[0x1c].pIo + 4) - 1U & (uint)uVar20];
          ppVar12 != (pgno *)0x0; ppVar12 = (pgno *)ppVar12[4]) {
        if (*ppVar12 == uVar20) goto LAB_00112971;
      }
    }
    ppVar12 = (pgno *)0x0;
LAB_00112971:
    if (ppVar12 == (pgno *)0x0) {
      iVar7 = lhAcquirePage((lhash_kv_engine *)pKv,(unqlite_page **)&local_80);
      pSVar19 = local_80.pAllocator;
      if (iVar7 != 0) {
        return iVar7;
      }
      local_50 = lhNewPage((lhash_kv_engine *)pKv,(unqlite_page *)local_80.pAllocator,(lhpage *)0x0)
      ;
      if (local_50 == (lhpage *)0x0) {
        return -1;
      }
      uVar10 = lhSetEmptyPage(local_50);
      if ((uVar10 == 0) &&
         (uVar10 = lhStoreCell(local_50,local_88,nKeyLen,pData,local_58,uVar8,1), uVar10 == 0)) {
        uVar10 = lhMapWriteRecord((lhash_kv_engine *)pKv,uVar20,(pgno)pSVar19->pBlocks);
      }
      puVar14 = pKv->pIo;
      goto LAB_0011325a;
    }
    iVar9 = lhLoadPage((lhash_kv_engine *)pKv,ppVar12[1],(lhpage *)0x0,&local_50,(int)uVar16);
    if (iVar9 != 0) {
      return iVar9;
    }
    (*pKv->pIo->xDontMkHot)(local_50->pRaw);
    pp_Var23 = local_88;
    pCell = lhFindCell(local_50,local_88,nKeyLen,uVar8);
    plVar3 = local_50;
    if (pCell != (lhcell *)0x0) {
      plVar3 = pCell->pPage;
      plVar2 = plVar3->pHash;
      local_a8 = (undefined1 *)pData;
      if ((int)local_60 == 0) {
        uVar10 = (*plVar2->pIo->xWrite)(plVar3->pRaw);
        if (uVar10 != 0) goto LAB_0011324e;
        if (pCell->iOvfl != 0) {
          uVar10 = (*plVar2->pIo->xGet)
                             (plVar2->pIo->pHandle,pCell->iDataPage,(unqlite_page **)&local_80);
          if (uVar10 != 0) goto LAB_0011324e;
          p_Var5 = (local_80.pAllocator)->pMutexMethods->xGlobalInit;
          pVar24 = (ulong)p_Var5 >> 0x38 | ((ulong)p_Var5 & 0xff000000000000) >> 0x28 |
                   ((ulong)p_Var5 & 0xff0000000000) >> 0x18 | ((ulong)p_Var5 & 0xff00000000) >> 8 |
                   ((ulong)p_Var5 & 0xff000000) << 8 | ((ulong)p_Var5 & 0xff0000) << 0x18 |
                   ((ulong)p_Var5 & 0xff00) << 0x28 | (long)p_Var5 << 0x38;
          local_90 = local_80.pAllocator;
          local_60 = plVar3;
          if (pVar24 == 0) goto LAB_00112eac;
          goto LAB_00112e6a;
        }
        puVar18 = plVar3->pRaw->zData + (pCell->nKey + (uint)pCell->iStart + 0x1a);
        if (pCell->nData == nDataLen) {
          SyMemcpy(pData,puVar18,(sxu32)nDataLen);
          goto LAB_00113555;
        }
        if ((ulong)nDataLen < pCell->nData) {
          SyMemcpy(pData,puVar18,(sxu32)nDataLen);
          *(ulong *)(plVar3->pRaw->zData + (ulong)pCell->iStart + 8) =
               (ulong)nDataLen >> 0x38 | (nDataLen & 0xff000000000000U) >> 0x28 |
               (nDataLen & 0xff0000000000U) >> 0x18 | (nDataLen & 0xff00000000U) >> 8 |
               (nDataLen & 0xff000000U) << 8 | (nDataLen & 0xff0000U) << 0x18 |
               (nDataLen & 0xff00U) << 0x28 | nDataLen << 0x38;
          lhRestoreSpace(plVar3,(short)*(undefined4 *)&pCell->iStart + (short)pCell->nKey +
                                (short)nDataLen + 0x1a,(short)(int)pCell->nData - (short)nDataLen);
          pCell->nData = nDataLen;
          goto LAB_00113555;
        }
        local_80.pAllocator = (SyMemBackend *)((ulong)local_80.pAllocator & 0xffffffffffff0000);
        iVar7 = lhAllocateSpace(plVar3,(ulong)(pCell->nKey + 0x1a) + nDataLen,(sxu16 *)&local_80);
        if (iVar7 == 0) {
          uVar1 = pCell->iStart;
          uVar10 = (uint)uVar1;
          sVar22 = pCell->nData;
          lhMoveLocalCell(pCell,(sxu16)local_80.pAllocator,pData,nDataLen);
          lhRestoreSpace(plVar3,uVar1,(short)pCell->nKey + (short)(int)sVar22 + 0x1a);
LAB_00113549:
          bVar25 = true;
        }
        else {
          bVar25 = false;
          uVar10 = lhCellWriteOvflPayload
                             (pCell,plVar3->pRaw->zData + (ulong)pCell->iStart + 0x1a,pCell->nKey,
                              pData,nDataLen,0);
          if (uVar10 == 0) {
            *(ulong *)(plVar3->pRaw->zData + (ulong)pCell->iStart + 8) =
                 (ulong)nDataLen >> 0x38 | (nDataLen & 0xff000000000000U) >> 0x28 |
                 (nDataLen & 0xff0000000000U) >> 0x18 | (nDataLen & 0xff00000000U) >> 8 |
                 (nDataLen & 0xff000000U) << 8 | (nDataLen & 0xff0000U) << 0x18 |
                 (nDataLen & 0xff00U) << 0x28 | nDataLen << 0x38;
            lhRestoreSpace(plVar3,(short)*(undefined4 *)&pCell->iStart + 0x1a,
                           (short)(int)pCell->nData + (short)pCell->nKey);
            pCell->nData = nDataLen;
            goto LAB_00113549;
          }
        }
        if (!bVar25) goto LAB_0011324e;
        goto LAB_00113555;
      }
      puVar14 = plVar2->pIo;
      if (CARRY8(pCell->nData,nDataLen)) {
        (*puVar14->xErr)(puVar14->pHandle,"Append operation will cause data overflow");
        uVar10 = 0xfffffff9;
        goto LAB_0011324e;
      }
      uVar10 = (*puVar14->xWrite)(plVar3->pRaw);
      if (uVar10 != 0) goto LAB_0011324e;
      if (pCell->iOvfl != 0) {
        uVar10 = (*plVar2->pIo->xGet)
                           (plVar2->pIo->pHandle,pCell->iDataPage,(unqlite_page **)&local_80);
        if (uVar10 != 0) goto LAB_0011324e;
        pSVar4 = (local_80.pAllocator)->pMutexMethods;
        p_Var5 = pSVar4->xGlobalInit;
        pVar24 = (ulong)p_Var5 >> 0x38 | ((ulong)p_Var5 & 0xff000000000000) >> 0x28 |
                 ((ulong)p_Var5 & 0xff0000000000) >> 0x18 | ((ulong)p_Var5 & 0xff00000000) >> 8 |
                 ((ulong)p_Var5 & 0xff000000) << 8 | ((ulong)p_Var5 & 0xff0000) << 0x18 |
                 ((ulong)p_Var5 & 0xff00) << 0x28 | (long)p_Var5 << 0x38;
        pp_Var23 = (_func_void **)((long)&pSVar4->xGlobalInit + (ulong)pCell->iDataOfft);
        puVar21 = (undefined1 *)((long)&pSVar4->xGlobalInit + (long)plVar2->iPageSize);
        uVar8 = plVar2->iPageSize - (uint)pCell->iDataOfft;
        sVar22 = pCell->nData;
        local_60 = plVar3;
        goto LAB_00112d76;
      }
      local_90 = (SyMemBackend *)((ulong)local_90 & 0xffffffffffff0000);
      iVar7 = lhAllocateSpace(plVar3,pCell->nData + nDataLen + (ulong)(pCell->nKey + 0x1a),
                              (sxu16 *)&local_90);
      if (iVar7 != 0) {
        puVar18 = plVar3->pRaw->zData;
        uVar10 = lhCellWriteOvflPayload
                           (pCell,puVar18 + (ulong)pCell->iStart + 0x1a,pCell->nKey,
                            puVar18 + (pCell->iStart + 0x1a + pCell->nKey),pCell->nData,pData,
                            nDataLen,0);
        if (uVar10 != 0) goto LAB_0011324e;
        uVar16 = pCell->nData + nDataLen;
        *(ulong *)(plVar3->pRaw->zData + (ulong)pCell->iStart + 8) =
             uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
             (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
             (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 | (uVar16 & 0xff00) << 0x28 |
             uVar16 << 0x38;
        lhRestoreSpace(plVar3,(short)*(undefined4 *)&pCell->iStart + 0x1a,
                       (short)(int)pCell->nData + (short)pCell->nKey);
        pCell->nData = pCell->nData + nDataLen;
        goto LAB_00113555;
      }
      uVar1 = pCell->iStart;
      nSize = (sxu32)pCell->nData;
      local_80.pAllocator = &plVar2->sAllocator;
      local_80.pBlob = (void *)0x0;
      local_80.nByte = 0;
      local_80.mByte = 0;
      local_80.nFlags = 0;
      local_60 = plVar3;
      uVar10 = SyBlobAppend(&local_80,plVar3->pRaw->zData + (pCell->nKey + (uint)uVar1 + 0x1a),nSize
                           );
      if (uVar10 == 0) {
        uVar10 = SyBlobAppend(&local_80,pData,(sxu32)local_58);
      }
      pChunk = local_80.pBlob;
      if (uVar10 == 0) {
        lhMoveLocalCell(pCell,(sxu16)local_90,local_80.pBlob,local_80._16_8_ & 0xffffffff);
        lhRestoreSpace(local_60,uVar1,(short)pCell->nKey + (short)nSize + 0x1a);
        if ((local_80.nFlags & 6) == 0) {
          goto joined_r0x0011339e;
        }
      }
      else if ((local_80.nFlags & 6) == 0) {
joined_r0x0011339e:
        if (local_80.mByte != 0) {
          SyMemBackendFree(local_80.pAllocator,pChunk);
        }
      }
      local_80.pBlob = (void *)0x0;
      local_80.nByte = 0;
      local_80.mByte = 0;
      local_80.nFlags = 0;
      if (uVar10 == 0) goto LAB_00113555;
      goto LAB_0011324e;
    }
    uVar16 = nDataLen;
    uVar10 = lhStoreCell(local_50,pp_Var23,nKeyLen,pData,nDataLen,uVar8,0);
    if (uVar10 == 0xffffffb7) {
      plVar2 = plVar3->pHash;
      if (plVar2->nBuckRec != 0) {
        for (plVar13 = plVar2->apMap[plVar2->nBuckSize - 1 & (uint)plVar2->split_bucket];
            plVar13 != (lhash_bmap_rec *)0x0; plVar13 = plVar13->pNextCol) {
          if (plVar13->iLogic == plVar2->split_bucket) goto LAB_00112a49;
        }
      }
      plVar13 = (lhash_bmap_rec *)0x0;
LAB_00112a49:
      if (plVar13 == (lhash_bmap_rec *)0x0) {
        uVar10 = 0xffffffe8;
        bVar25 = false;
      }
      else {
        bVar25 = false;
        uVar10 = lhLoadPage(plVar2,plVar13->iReal,(lhpage *)0x0,(lhpage **)&local_80,(int)uVar16);
        if ((uVar10 == 0) &&
           (uVar10 = lhAcquirePage(plVar2,(unqlite_page **)&local_90), pSVar19 = local_90,
           uVar10 == 0)) {
          bVar25 = false;
          pPage_00 = (SyMemBackend *)lhNewPage(plVar2,(unqlite_page *)local_90,(lhpage *)0x0);
          if (pPage_00 == (SyMemBackend *)0x0) {
            uVar10 = 0xffffffff;
          }
          else {
            local_40 = pSVar19;
            local_48 = pPage_00;
            uVar10 = lhSetEmptyPage((lhpage *)pPage_00);
            bVar25 = false;
            if ((uVar10 == 0) &&
               (uVar10 = lhMapWriteRecord(plVar2,plVar2->max_split_bucket + plVar2->split_bucket,
                                          (pgno)local_40->pBlocks), uVar10 == 0)) {
              bVar25 = (_func_void_void_ptr *)plVar3->pRaw->iPage ==
                       (local_80.pAllocator)->pMethods->xFree;
              uVar10 = lhPageSplit((lhpage *)local_80.pAllocator,(lhpage *)local_48,
                                   plVar2->split_bucket,plVar2->nmax_split_nucket - 1);
              if (uVar10 == 0) {
                plVar2->split_bucket = plVar2->split_bucket + 1;
                uVar10 = (*plVar2->pIo->xWrite)(plVar2->pHeader);
                if (uVar10 == 0) {
                  uVar20 = plVar2->split_bucket;
                  if (uVar20 < plVar2->max_split_bucket) {
                    *(ulong *)(plVar2->pHeader->zData + 0x10) =
                         uVar20 >> 0x38 | (uVar20 & 0xff000000000000) >> 0x28 |
                         (uVar20 & 0xff0000000000) >> 0x18 | (uVar20 & 0xff00000000) >> 8 |
                         (uVar20 & 0xff000000) << 8 | (uVar20 & 0xff0000) << 0x18 |
                         (uVar20 & 0xff00) << 0x28 | uVar20 << 0x38;
                  }
                  else {
                    plVar2->split_bucket = 0;
                    plVar2->max_split_bucket = plVar2->nmax_split_nucket;
                    pVar24 = plVar2->nmax_split_nucket * 2;
                    plVar2->nmax_split_nucket = pVar24;
                    if (pVar24 == 0) {
                      (*plVar2->pIo->xErr)
                                (plVar2->pIo->pHandle,"Database page (64-bit integer) limit reached"
                                );
                      uVar10 = 0xfffffff9;
                      goto LAB_00112a85;
                    }
                    puVar18 = plVar2->pHeader->zData;
                    puVar18[0x10] = '\0';
                    puVar18[0x11] = '\0';
                    puVar18[0x12] = '\0';
                    puVar18[0x13] = '\0';
                    puVar18[0x14] = '\0';
                    puVar18[0x15] = '\0';
                    puVar18[0x16] = '\0';
                    puVar18[0x17] = '\0';
                    uVar20 = plVar2->max_split_bucket;
                    *(ulong *)(plVar2->pHeader->zData + 0x18) =
                         uVar20 >> 0x38 | (uVar20 & 0xff000000000000) >> 0x28 |
                         (uVar20 & 0xff0000000000) >> 0x18 | (uVar20 & 0xff00000000) >> 8 |
                         (uVar20 & 0xff000000) << 8 | (uVar20 & 0xff0000) << 0x18 |
                         (uVar20 & 0xff00) << 0x28 | uVar20 << 0x38;
                  }
                  uVar10 = 0;
                }
                goto LAB_00112a85;
              }
            }
            (*plVar2->pIo->xPageUnref)((unqlite_page *)local_48->pMethods);
          }
        }
      }
LAB_00112a85:
      nDataLen = local_58;
      if ((uVar10 == 0) && (uVar10 = 0xffffffdf, !bVar25)) {
        uVar16 = local_58;
        uVar10 = lhStoreCell(plVar3,local_88,nKeyLen,pData,local_58,uVar8,1);
      }
    }
    if (uVar10 != 0xffffffdf) goto LAB_0011324e;
    iVar7 = iVar7 + 1;
  } while (iVar7 != 3);
  uVar10 = 0xffffffdf;
  goto LAB_0011324e;
LAB_00112d76:
  if (puVar21 <= pp_Var23) {
    puVar14 = plVar2->pIo;
    if (pVar24 == 0) {
      (*puVar14->xErr)(puVar14->pHandle,"Corrupt overflow page");
      uVar10 = 0xffffffe8;
      goto LAB_0011324e;
    }
    uVar10 = (*puVar14->xGet)(puVar14->pHandle,pVar24,(unqlite_page **)&local_90);
    if (uVar10 != 0) goto LAB_0011324e;
    p_Var5 = local_90->pMutexMethods->xGlobalInit;
    pVar24 = (ulong)p_Var5 >> 0x38 | ((ulong)p_Var5 & 0xff000000000000) >> 0x28 |
             ((ulong)p_Var5 & 0xff0000000000) >> 0x18 | ((ulong)p_Var5 & 0xff00000000) >> 8 |
             ((ulong)p_Var5 & 0xff000000) << 8 | ((ulong)p_Var5 & 0xff0000) << 0x18 |
             ((ulong)p_Var5 & 0xff00) << 0x28 | (long)p_Var5 << 0x38;
    (*plVar2->pIo->xPageUnref)((unqlite_page *)local_80.pAllocator);
    pp_Var23 = &local_90->pMutexMethods->xGlobalRelease;
    iVar7 = pCell->pPage->pHash->iPageSize;
    puVar21 = (undefined1 *)((long)&local_90->pMutexMethods->xGlobalInit + (long)iVar7);
    uVar8 = iVar7 - 8;
    local_80.pAllocator = local_90;
  }
  uVar16 = (ulong)uVar8;
  if (sVar22 < uVar16) goto LAB_00113238;
  pp_Var23 = (_func_void **)((long)pp_Var23 + uVar16);
  sVar22 = sVar22 - uVar16;
  goto LAB_00112d76;
LAB_00113238:
  uVar10 = (*plVar2->pIo->xWrite)((unqlite_page *)local_80.pAllocator);
  if (uVar10 != 0) goto LAB_0011324e;
  pp_Var15 = (_func_void **)((long)pData + local_58);
  pp_Var23 = (_func_void **)((long)pp_Var23 + sVar22);
  plVar17 = plVar2;
  local_88 = pp_Var15;
  do {
    iVar7 = 4;
    if (local_a8 < pp_Var15) {
      if (puVar21 <= pp_Var23) {
        uVar8 = lhAcquirePage(plVar2,(unqlite_page **)&local_90);
        iVar7 = 1;
        if ((uVar8 != 0) || (uVar8 = (*plVar2->pIo->xWrite)((unqlite_page *)local_90), uVar8 != 0))
        {
          plVar17 = (lhash_kv_engine *)(ulong)uVar8;
          pp_Var15 = local_88;
          goto LAB_00113460;
        }
        pSVar6 = local_90->pBlocks;
        (local_80.pAllocator)->pMutexMethods->xGlobalInit =
             (_func_int *)
             ((ulong)pSVar6 >> 0x38 | ((ulong)pSVar6 & 0xff000000000000) >> 0x28 |
              ((ulong)pSVar6 & 0xff0000000000) >> 0x18 | ((ulong)pSVar6 & 0xff00000000) >> 8 |
              ((ulong)pSVar6 & 0xff000000) << 8 | ((ulong)pSVar6 & 0xff0000) << 0x18 |
              ((ulong)pSVar6 & 0xff00) << 0x28 | (long)pSVar6 << 0x38);
        (*plVar2->pIo->xPageUnref)((unqlite_page *)local_80.pAllocator);
        local_90->pMutexMethods->xGlobalInit = (_func_int *)0x0;
        local_80.pAllocator = local_90;
        pp_Var23 = &local_90->pMutexMethods->xGlobalRelease;
        puVar21 = (undefined1 *)
                  ((long)&local_90->pMutexMethods->xGlobalInit + (long)plVar2->iPageSize);
        pp_Var15 = local_88;
      }
      uVar10 = (int)puVar21 - (int)pp_Var23;
      uVar8 = (int)pp_Var15 - (int)local_a8;
      if (uVar10 <= uVar8) {
        uVar8 = uVar10;
      }
      SyMemcpy(local_a8,pp_Var23,uVar8);
      local_a8 = local_a8 + uVar8;
      pp_Var23 = (_func_void **)((long)pp_Var23 + (ulong)uVar8);
      iVar7 = 0;
      pp_Var15 = local_88;
    }
LAB_00113460:
    uVar10 = (uint)plVar17;
  } while (iVar7 == 0);
  if (iVar7 != 4) goto LAB_0011324e;
  (*plVar2->pIo->xPageUnref)((unqlite_page *)local_80.pAllocator);
  uVar16 = local_58 + pCell->nData;
  goto LAB_001134ee;
  while( true ) {
    p_Var5 = local_90->pMutexMethods->xGlobalInit;
    if (local_90 != local_80.pAllocator) {
      lhRestorePage(plVar2,(unqlite_page *)local_90);
      (*plVar2->pIo->xPageUnref)((unqlite_page *)local_90);
    }
    pVar24 = (ulong)p_Var5 >> 0x38 | ((ulong)p_Var5 & 0xff000000000000) >> 0x28 |
             ((ulong)p_Var5 & 0xff0000000000) >> 0x18 | ((ulong)p_Var5 & 0xff00000000) >> 8 |
             ((ulong)p_Var5 & 0xff000000) << 8 | ((ulong)p_Var5 & 0xff0000) << 0x18 |
             ((ulong)p_Var5 & 0xff00) << 0x28 | (long)p_Var5 << 0x38;
    if (pVar24 == 0) break;
LAB_00112e6a:
    iVar7 = (*plVar2->pIo->xGet)(plVar2->pIo->pHandle,pVar24,(unqlite_page **)&local_90);
    if (iVar7 != 0) break;
  }
LAB_00112eac:
  pSVar4 = (local_80.pAllocator)->pMutexMethods;
  uVar1 = pCell->iDataOfft;
  iVar7 = plVar2->iPageSize;
  uVar10 = (*plVar2->pIo->xWrite)((unqlite_page *)local_80.pAllocator);
  if (uVar10 != 0) goto LAB_0011324e;
  pp_Var15 = (_func_void **)((long)&pSVar4->xGlobalInit + (long)iVar7);
  pp_Var23 = (_func_void **)((long)&pSVar4->xGlobalInit + (ulong)uVar1);
  (local_80.pAllocator)->pMutexMethods->xGlobalInit = (_func_int *)0x0;
  plVar17 = plVar2;
  do {
    iVar7 = 4;
    if (local_a8 < (void *)((long)pData + nDataLen)) {
      if (pp_Var23 < pp_Var15) {
LAB_00112f0e:
        uVar10 = (int)pp_Var15 - (int)pp_Var23;
        uVar8 = (int)(void *)((long)pData + nDataLen) - (int)local_a8;
        if (uVar10 <= uVar8) {
          uVar8 = uVar10;
        }
        local_88 = pp_Var23;
        SyMemcpy(local_a8,pp_Var23,uVar8);
        local_a8 = (undefined1 *)((long)local_a8 + (ulong)uVar8);
        pp_Var23 = (_func_void **)((long)local_88 + (ulong)uVar8);
        iVar7 = 0;
      }
      else {
        local_88 = pp_Var15;
        uVar8 = lhAcquirePage(plVar2,(unqlite_page **)&local_38);
        iVar7 = 1;
        if (uVar8 == 0) {
          local_48 = local_38;
          uVar8 = (*plVar2->pIo->xWrite)((unqlite_page *)local_38);
          pSVar19 = local_48;
          if (uVar8 == 0) {
            pSVar6 = local_48->pBlocks;
            (local_80.pAllocator)->pMutexMethods->xGlobalInit =
                 (_func_int *)
                 ((ulong)pSVar6 >> 0x38 | ((ulong)pSVar6 & 0xff000000000000) >> 0x28 |
                  ((ulong)pSVar6 & 0xff0000000000) >> 0x18 | ((ulong)pSVar6 & 0xff00000000) >> 8 |
                  ((ulong)pSVar6 & 0xff000000) << 8 | ((ulong)pSVar6 & 0xff0000) << 0x18 |
                  ((ulong)pSVar6 & 0xff00) << 0x28 | (long)pSVar6 << 0x38);
            (*plVar2->pIo->xPageUnref)((unqlite_page *)local_80.pAllocator);
            pSVar19->pMutexMethods->xGlobalInit = (_func_int *)0x0;
            pSVar4 = pSVar19->pMutexMethods;
            pp_Var23 = &pSVar4->xGlobalRelease;
            pp_Var15 = (_func_void **)((long)&pSVar4->xGlobalInit + (long)plVar2->iPageSize);
            local_80.pAllocator = pSVar19;
            goto LAB_00112f0e;
          }
        }
        plVar17 = (lhash_kv_engine *)(ulong)uVar8;
        pp_Var15 = local_88;
      }
    }
    uVar10 = (uint)plVar17;
  } while (iVar7 == 0);
  if (iVar7 != 4) goto LAB_0011324e;
  (*plVar2->pIo->xPageUnref)((unqlite_page *)local_80.pAllocator);
  uVar16 = local_58;
LAB_001134ee:
  pCell->nData = uVar16;
  *(ulong *)(local_60->pRaw->zData + (ulong)pCell->iStart + 8) =
       uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 | (uVar16 & 0xff0000000000) >> 0x18 |
       (uVar16 & 0xff00000000) >> 8 | (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
       (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38;
LAB_00113555:
  uVar10 = 0;
LAB_0011324e:
  puVar14 = pKv->pIo;
  pSVar19 = (SyMemBackend *)local_50->pRaw;
LAB_0011325a:
  (*puVar14->xPageUnref)((unqlite_page *)pSVar19);
  return uVar10;
}

Assistant:

static int lh_record_insert(
	  unqlite_kv_engine *pKv,         /* KV store */
	  const void *pKey,sxu32 nKeyLen, /* Payload: Key */
	  const void *pData,unqlite_int64 nDataLen, /* Payload: data */
	  int is_append /* True for an append operation */
	  )
{
	lhash_kv_engine *pEngine = (lhash_kv_engine *)pKv;
	lhash_bmap_rec *pRec;
	unqlite_page *pRaw;
	lhpage *pPage;
	lhcell *pCell;
	pgno iBucket;
	sxu32 nHash;
	int iCnt;
	int rc;

	/* Acquire the first page (DB hash Header) so that everything gets loaded automatically */
	rc = pEngine->pIo->xGet(pEngine->pIo->pHandle,1,&pEngine->pHeader);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	iCnt = 0;
	/* Compute the hash of the key first */
	nHash = pEngine->xHash(pKey,(sxu32)nKeyLen);
retry:
	/* Extract the logical bucket number */
	iBucket = nHash & (pEngine->nmax_split_nucket - 1);
	if( iBucket >= pEngine->split_bucket + pEngine->max_split_bucket ){
		/* Low mask */
		iBucket = nHash & (pEngine->max_split_bucket - 1);
	}
	/* Map the logical bucket number to real page number */
	pRec = lhMapFindBucket(pEngine,iBucket);
	if( pRec == 0 ){
		/* Request a new page */
		rc = lhAcquirePage(pEngine,&pRaw);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		/* Initialize the page */
		pPage = lhNewPage(pEngine,pRaw,0);
		if( pPage == 0 ){
			return UNQLITE_NOMEM;
		}
		/* Mark as an empty page */
		rc = lhSetEmptyPage(pPage);
		if( rc != UNQLITE_OK ){
			pEngine->pIo->xPageUnref(pRaw); /* pPage will be released during this call */
			return rc;
		}
		/* Store the cell */
		rc = lhStoreCell(pPage,pKey,nKeyLen,pData,nDataLen,nHash,1);
		if( rc == UNQLITE_OK ){
			/* Install and write the logical map record */
			rc = lhMapWriteRecord(pEngine,iBucket,pRaw->iPage);
		}
		pEngine->pIo->xPageUnref(pRaw);
		return rc;
	}else{
		/* Load the page */
		rc = lhLoadPage(pEngine,pRec->iReal,0,&pPage,0);
		if( rc != UNQLITE_OK ){
			/* IO error, unlikely scenario */
			return rc;
		}
		/* Do not add this page to the hot dirty list */
		pEngine->pIo->xDontMkHot(pPage->pRaw);
		/* Lookup for the cell */
		pCell = lhFindCell(pPage,pKey,(sxu32)nKeyLen,nHash);
		if( pCell == 0 ){
			/* Create the record */
			rc = lhRecordInstall(pPage,nHash,pKey,nKeyLen,pData,nDataLen);
			if( rc == SXERR_RETRY && iCnt++ < 2 ){
				rc = UNQLITE_OK;
				goto retry;
			}
		}else{
			if( is_append ){
				/* Append operation */
				rc = lhRecordAppend(pCell,pData,nDataLen);
			}else{
				/* Overwrite old value */
				rc = lhRecordOverwrite(pCell,pData,nDataLen);
			}
		}
		pEngine->pIo->xPageUnref(pPage->pRaw);
	}
	return rc;
}